

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-0.c
# Opt level: O2

int CheckFromArray(void)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uStack_38;
  int n;
  
  uStack_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar1 = -1;
  }
  else {
    uVar3 = (ulong)(uint)testN;
    for (lVar4 = 0; lVar4 < testInOut[(int)uVar3].n; lVar4 = lVar4 + 1) {
      pcVar2 = ScanInt((FILE *)__stream,&n);
      if (pcVar2 != "PASSED") {
LAB_0010243d:
        fclose(__stream);
        goto LAB_00102445;
      }
      uVar3 = (ulong)testN;
      if (*(int *)(uVar3 * 0x90 + 0x10632c + lVar4 * 4) != n) {
        printf("wrong output -- ");
        goto LAB_0010243d;
      }
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar1 == 0) {
      puts("PASSED");
      iVar1 = 0;
    }
    else {
LAB_00102445:
      puts("FAILED");
      iVar1 = 1;
    }
  }
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < testInOut[testN].n; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if (testInOut[testN].out[i] != n) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}